

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalDelete::Deserialize(LogicalDelete *this,Deserializer *deserializer)

{
  LogicalDelete *this_00;
  ClientContext *context;
  pointer pLVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalDelete_*,_false> local_28;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_20;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xc8);
  this_00 = (LogicalDelete *)operator_new(0x98);
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  LogicalDelete(this_00,context,
                (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                &stack0xffffffffffffffe0);
  local_28._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
           operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"table_index",&pLVar1->table_index);
  pLVar1 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
           operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                       *)&local_28);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xca,"return_chunk",&pLVar1->return_chunk);
  pLVar1 = unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>::
           operator->((unique_ptr<duckdb::LogicalDelete,_std::default_delete<duckdb::LogicalDelete>,_true>
                       *)&local_28);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcb,"expressions",&(pLVar1->super_LogicalOperator).expressions);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_28._M_head_impl;
  if ((_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
      local_20._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(_func_int **)local_20._M_head_impl + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalDelete::Deserialize(Deserializer &deserializer) {
	auto table_info = deserializer.ReadPropertyWithDefault<unique_ptr<CreateInfo>>(200, "table_info");
	auto result = duckdb::unique_ptr<LogicalDelete>(new LogicalDelete(deserializer.Get<ClientContext &>(), table_info));
	deserializer.ReadPropertyWithDefault<idx_t>(201, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<bool>(202, "return_chunk", result->return_chunk);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(203, "expressions", result->expressions);
	return std::move(result);
}